

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O2

ostream * std::operator<<(ostream *os,vector<unsigned_int,_std::allocator<unsigned_int>_> *buf)

{
  pointer puVar1;
  byte bVar2;
  char cVar3;
  uint *b;
  pointer puVar4;
  ios state;
  ios aiStack_138 [264];
  
  cVar3 = std::ios::fill();
  std::ios::ios(aiStack_138,(streambuf *)0x0);
  std::ios::copyfmt((ios *)aiStack_138);
  puVar1 = (buf->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  bVar2 = 0;
  for (puVar4 = (buf->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    std::ios::copyfmt((ios *)(os + *(long *)(*(long *)os + -0x18)));
    if (!(bool)(~bVar2 & 1 | cVar3 == '\0')) {
      std::operator<<(os,cVar3);
    }
    std::ostream::_M_insert<unsigned_long>((ulong)os);
    bVar2 = 1;
  }
  std::ios_base::~ios_base((ios_base *)aiStack_138);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream&os, const std::vector<T, A>& buf)
{
    auto fillchar = os.fill();
    std::ios state(NULL);  state.copyfmt(os);

    bool first= true;
    for (const auto& b : buf) {
        os.copyfmt(state);
        if (!first && fillchar) os << fillchar;
        if constexpr (std::is_integral_v<T> && sizeof(T)==1) {
            // This makes sure the numbers in byte and char vectors are printed 
            // as numbers, instead of as characters.
            os << +b;
        }
        else {
            os << b;
        }
        first= false;
    }
    return os;
}